

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fromucs.c
# Opt level: O2

wchar_t charset_from_unicode
                  (wchar_t **input,wchar_t *inlen,char *output,wchar_t outlen,wchar_t charset,
                  charset_state *state,char *errstr,wchar_t errlen)

{
  char *pcVar1;
  wchar_t wVar2;
  charset_spec *pcVar3;
  int local_60;
  char *local_58;
  wchar_t local_50;
  char *local_48;
  wchar_t local_40;
  int local_3c;
  charset_state local_38;
  
  pcVar3 = charset_find_spec(charset);
  local_3c = 0;
  local_48 = errstr;
  local_40 = errlen;
  if (state == (charset_state *)0x0) {
    local_38.s0 = 0;
  }
  else {
    local_38 = (charset_state)state->s0;
  }
  wVar2 = *inlen;
  local_58 = output;
  local_50 = outlen;
  while (pcVar1 = local_58, L'\0' < wVar2) {
    (*pcVar3->write)(pcVar3,(long)**input,&local_38,charset_emit,&local_58);
    if (local_3c != 0) break;
    *input = *input + 1;
    wVar2 = *inlen + L'\xffffffff';
    *inlen = wVar2;
  }
  local_60 = (int)output;
  return (int)pcVar1 - local_60;
}

Assistant:

int charset_from_unicode(const wchar_t **input, int *inlen,
                         char *output, int outlen,
                         int charset, charset_state *state,
                         const char *errstr, int errlen)
{
    charset_spec const *spec = charset_find_spec(charset);
    charset_state localstate;
    struct charset_emit_param param;

    param.output = output;
    param.outlen = outlen;
    param.stopped = 0;

    /*
     * charset_emit will expect a valid errstr.
     */
    if (!errstr) {
        /* *shrug* this is good enough, and consistent across all SBCS... */
        param.errstr = ".";
        param.errlen = 1;
    }
    param.errstr = errstr;
    param.errlen = errlen;

    if (!state) {
        localstate.s0 = 0;
    } else {
        localstate = *state;           /* structure copy */
    }
    state = &localstate;

    while (*inlen > 0) {
        int lenbefore = param.output - output;
        spec->write(spec, **input, &localstate, charset_emit, &param);
        if (param.stopped) {
            /*
             * The emit function has _tried_ to output some
             * characters, but ran up against the end of the
             * buffer. Leave immediately, and return what happened
             * _before_ attempting to process this character.
             */
            return lenbefore;
        }
        if (state)
            *state = localstate;       /* structure copy */
        (*input)++;
        (*inlen)--;
    }
    return param.output - output;
}